

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

uchar GetDepth(Col_Word list)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  byte *local_18;
  Col_Word list_local;
  
  local_18 = (byte *)list;
  while( true ) {
    if (local_18 == (byte *)0x0) {
      local_1c = 0;
    }
    else {
      if (((ulong)local_18 & 0xf) == 0) {
        if ((*local_18 & 2) == 0) {
          local_24 = 0xffffffff;
        }
        else {
          local_24 = *local_18 & 0xfffffffe;
        }
        local_20 = local_24;
      }
      else {
        local_20 = immediateWordTypes[(ulong)local_18 & 0x1f];
      }
      local_1c = local_20;
    }
    if (local_1c != 0xfffffffa) break;
    local_18 = (byte *)((ulong)local_18 & 0xfffffffffffffff7);
  }
  if (local_1c == 0x1e) {
    list_local._7_1_ = local_18[1];
  }
  else if ((local_1c == 0x22) || (local_1c == 0x26)) {
    list_local._7_1_ = local_18[1];
  }
  else {
    list_local._7_1_ = 0;
  }
  return list_local._7_1_;
}

Assistant:

static unsigned char
GetDepth(
    Col_Word rope)  /*!< Rope node to get depth from. */
{
    switch (WORD_TYPE(rope)) {
    case WORD_TYPE_SUBROPE:
        return WORD_SUBROPE_DEPTH(rope);

    case WORD_TYPE_CONCATROPE:
        return WORD_CONCATROPE_DEPTH(rope);

    /* WORD_TYPE_UNKNOWN */

    default:
        return 0;
    }
}